

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.h
# Opt level: O1

void __thiscall
RewardModelMappingSparseMapped::Set
          (RewardModelMappingSparseMapped *this,Index s_i,Index ja_i,double rew)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  _Base_ptr p_Var4;
  iterator __position;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  double local_48;
  sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_40;
  
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = rew;
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  auVar7 = vandpd_avx512vl(auVar9._0_16_,auVar7);
  local_40.
  super_container_reference<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  .c_ = &this->_m_R;
  uVar5 = (ulong)s_i;
  uVar6 = (ulong)ja_i;
  local_48 = rew;
  local_40.i_ = uVar5;
  local_40.j_ = uVar6;
  if (auVar7._0_8_ <= 1e-12) {
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::get_d(&local_40);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_40.d_;
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar7 = vandpd_avx512vl(auVar8,auVar3);
    if (1e-12 < auVar7._0_8_) {
      uVar6 = uVar5 * (this->_m_R).size2_ + uVar6;
      p_Var1 = &(this->_m_R).data_.
                super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                ._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = *(_Base_ptr *)
                ((long)&(this->_m_R).data_.
                        super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                        ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
      p_Var4 = &p_Var1->_M_header;
      for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar6])
      {
        if (*(ulong *)(p_Var2 + 1) >= uVar6) {
          p_Var4 = p_Var2;
        }
      }
      __position._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (__position._M_node = p_Var4, uVar6 < *(ulong *)(p_Var4 + 1))) {
        __position._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)__position._M_node != p_Var1) {
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,double>,std::_Select1st<std::pair<unsigned_long_const,double>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,double>,std::_Select1st<std::pair<unsigned_long_const,double>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
                            *)&(this->_m_R).data_,__position);
      }
    }
  }
  else {
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::set(&local_40,&local_48);
  }
  return;
}

Assistant:

void Set(Index s_i, Index ja_i, double rew)
        {
            // make sure reward is not 0
            if(fabs(rew) > REWARD_PRECISION)
                _m_R(s_i,ja_i)=rew;
            // check if we already defined this element, if so remove it
            else if(fabs(_m_R(s_i,ja_i))>REWARD_PRECISION)
                _m_R.erase_element(s_i,ja_i);

        }